

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lbitlib.c
# Opt level: O2

int b_arshift(lua_State *L)

{
  lua_Unsigned r;
  uint uVar1;
  lua_Integer lVar2;
  uint u;
  
  r = luaL_checkunsigned(L,1);
  lVar2 = luaL_checkinteger(L,2);
  uVar1 = (uint)lVar2;
  if ((int)r < 0 && -1 < (int)uVar1) {
    u = ~(0xffffffffU >> ((byte)lVar2 & 0x1f)) | r >> ((byte)lVar2 & 0x1f);
    if (0x1f < uVar1) {
      u = 0xffffffff;
    }
    lua_pushunsigned(L,u);
  }
  else {
    b_shift(L,r,-uVar1);
  }
  return 1;
}

Assistant:

static int b_arshift (lua_State *L) {
  b_uint r = luaL_checkunsigned(L, 1);
  int i = luaL_checkint(L, 2);
  if (i < 0 || !(r & ((b_uint)1 << (LUA_NBITS - 1))))
    return b_shift(L, r, -i);
  else {  /* arithmetic shift for 'negative' number */
    if (i >= LUA_NBITS) r = ALLONES;
    else
      r = trim((r >> i) | ~(~(b_uint)0 >> i));  /* add signal bit */
    lua_pushunsigned(L, r);
    return 1;
  }
}